

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int codebook_decode_start(vorb *f,Codebook *c)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (c->lookup_type == '\0') {
    iVar4 = -1;
  }
  else {
    if (f->valid_bits < 10) {
      prep_huffman(f);
    }
    sVar2 = c->fast_huffman[f->acc & 0x3ff];
    if (sVar2 < 0) {
      iVar4 = codebook_decode_scalar_raw(f,c);
    }
    else {
      bVar1 = c->codeword_lengths[(int)sVar2];
      f->acc = f->acc >> (bVar1 & 0x1f);
      iVar3 = f->valid_bits - (uint)bVar1;
      iVar5 = 0;
      if (0 < iVar3) {
        iVar5 = iVar3;
      }
      iVar4 = -1;
      if (-1 < iVar3) {
        iVar4 = (int)sVar2;
      }
      f->valid_bits = iVar5;
    }
    if ((c->sparse != '\0') && (c->sorted_entries <= iVar4)) {
      __assert_fail("z < c->sorted_entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                    ,0x6e9,"int codebook_decode_start(vorb *, Codebook *)");
    }
    if (-1 < iVar4) {
      return iVar4;
    }
    if ((f->bytes_in_seg == '\0') && (f->last_seg != 0)) {
      return iVar4;
    }
  }
  f->error = VORBIS_invalid_stream;
  return iVar4;
}

Assistant:

static int codebook_decode_start(vorb *f, Codebook *c)
{
   int z = -1;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)
      error(f, VORBIS_invalid_stream);
   else {
      DECODE_VQ(z,f,c);
      if (c->sparse) assert(z < c->sorted_entries);
      if (z < 0) {  // check for EOP
         if (!f->bytes_in_seg)
            if (f->last_seg)
               return z;
         error(f, VORBIS_invalid_stream);
      }
   }
   return z;
}